

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

bool slang::ast::isValidForIfaceVar(Type *type)

{
  bool bVar1;
  Type *type_00;
  iterator iVar2;
  reference ppFVar3;
  FieldSymbol *field;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range3;
  Type *ct;
  FieldSymbol *in_stack_ffffffffffffffc8;
  Type *in_stack_ffffffffffffffd0;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffffd8;
  bool local_1;
  
  type_00 = Type::getCanonicalType(in_stack_ffffffffffffffd0);
  bVar1 = Type::isVirtualInterface((Type *)0x81bae2);
  if (bVar1) {
    local_1 = false;
  }
  else {
    bVar1 = Type::isUnpackedArray((Type *)in_stack_ffffffffffffffc8);
    if (bVar1) {
      Type::getArrayElementType((Type *)in_stack_ffffffffffffffd8._M_current);
      local_1 = isValidForIfaceVar(type_00);
    }
    else {
      bVar1 = Type::isUnpackedStruct((Type *)0x81bb29);
      if (bVar1) {
        Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x81bb3c);
        iVar2 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                          ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                           in_stack_ffffffffffffffc8);
        iVar2 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                          (iVar2._M_current);
        while (bVar1 = __gnu_cxx::
                       operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                   *)iVar2._M_current,
                                  (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
          ppFVar3 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                    ::operator*((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                 *)&stack0xffffffffffffffd8);
          in_stack_ffffffffffffffc8 = *ppFVar3;
          ValueSymbol::getType((ValueSymbol *)0x81bb96);
          bVar1 = isValidForIfaceVar(type_00);
          if (!bVar1) {
            return false;
          }
          __gnu_cxx::
          __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
          ::operator++((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                        *)&stack0xffffffffffffffd8);
        }
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool isValidForIfaceVar(const Type& type) {
    auto& ct = type.getCanonicalType();
    if (ct.isVirtualInterface())
        return false;

    if (ct.isUnpackedArray())
        return isValidForIfaceVar(*ct.getArrayElementType());

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!isValidForIfaceVar(field->getType()))
                return false;
        }
    }

    return true;
}